

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

string * PrintColumn_abi_cxx11_
                   (string *__return_storage_ptr__,double x,size_t decDigits,size_t width)

{
  long lVar1;
  stringstream ss;
  long local_1b0;
  size_t sStack_1a8;
  size_t local_1a0 [3];
  uint auStack_188 [46];
  undefined1 auStack_d0 [168];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) & 0xfffffefb | 4;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] - 0x18)) & 0xffffff4f | 0x80;
  lVar1 = *(long *)(local_1b0 + -0x18);
  std::ios::fill();
  auStack_d0[lVar1] = 0x20;
  *(size_t *)((long)local_1a0 + *(long *)(local_1b0 + -0x18)) = width;
  *(size_t *)((long)&sStack_1a8 + *(long *)(local_1b0 + -0x18)) = decDigits;
  std::ostream::_M_insert<double>(x);
  celero::console::SetConsoleColor(Default);
  std::operator<<((ostream *)local_1a0," | ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintColumn(const double x, const size_t decDigits = PrintConstants::DoubleDecimals, const size_t width = PrintConstants::ColumnWidth)
{
	std::stringstream ss;
	ss << std::fixed << std::right;

	// fill space around displayed #
	ss.fill(' ');

	// set  width around displayed #
	ss.width(width);

	// set # places after decimal
	ss.precision(decDigits);
	ss << x;

	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
	ss << " | ";
	return ss.str();
}